

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

void __thiscall iDynTree::Material::Material(Material *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  Material(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Material::Material(): Material("") {}